

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

uint64_t writeBlockFingerprint(char *block,size_t psize)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  
  if (block == (char *)0x0) {
    return 0;
  }
  uVar3 = psize >> 4;
  uVar6 = psize >> 3;
  lVar7 = uVar3 + 1;
  pcVar8 = block + uVar3 + 1;
  lVar9 = 0;
  uVar1 = 0;
  do {
    uVar4 = lVar9 * uVar6 + uVar3;
    cVar2 = block[uVar4];
    if (uVar4 < psize - 1 && cVar2 == '\0') {
      lVar5 = 0;
      do {
        uVar4 = lVar7 + lVar5;
        cVar2 = pcVar8[lVar5];
        lVar5 = lVar5 + 1;
        if (psize - 1 <= uVar4) break;
      } while (cVar2 == '\0');
    }
    else {
      lVar5 = 0;
    }
    uVar1 = uVar1 | (ulong)(byte)((char)lVar5 + cVar2) << ((char)lVar9 * '\b' & 0x3fU);
    lVar9 = lVar9 + 1;
    pcVar8 = pcVar8 + uVar6;
    lVar7 = lVar7 + uVar6;
    if (lVar9 == 8) {
      return uVar1;
    }
  } while( true );
}

Assistant:

static uint64_t writeBlockFingerprint(char *block, size_t psize)
{
    size_t Start = psize / 16;
    size_t Stride = psize / 8;
    size_t print = 0;
    if (!block)
        return 0;
    for (size_t i = 0; i < 8; i++)
    {
        size_t Index = Start + Stride * i;
        unsigned char Component = 0;
        while ((block[Index] == 0) && (Index < (psize - 1)))
        {
            Component++;
            Index++;
        }
        Component += (unsigned char)block[Index];
        print |= (((size_t)Component) << (8 * i));
    }
    return print;
}